

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timeout.c
# Opt level: O3

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  uint uVar6;
  EVP_PKEY_CTX *in_RDI;
  uint uVar7;
  int len;
  char name [1024];
  socklen_t local_444;
  FILE *local_440;
  char local_438 [1032];
  
  init(in_RDI);
  pFVar2 = fopen("dnsrelay1.txt","r");
  if (pFVar2 == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
            ,0x2e,"%s:%s","file open error:",pcVar5);
    *piVar4 = 0;
LAB_001015fa:
    exit(1);
  }
  puts(&DAT_00103128);
  sleep(1000);
  iVar1 = __isoc99_fscanf(pFVar2,"%s",local_438);
  if (iVar1 == 1) {
    uVar6 = 1;
    uVar7 = 0;
    local_440 = pFVar2;
    do {
      printf("%d ===================== %s\n",(ulong)uVar6,local_438);
      iVar1 = write_dns_query(buffer,local_438,1);
      sVar3 = sendto(ss,buffer,(long)iVar1,0,(sockaddr *)&query_server,0x10);
      if (sVar3 < 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
                ,0x47,"%s:%s","sendto error:",pcVar5);
        *piVar4 = 0;
        pFVar2 = local_440;
      }
      local_444 = 0x10;
      sVar3 = recvfrom(ss,buffer,0x208,0,(sockaddr *)&query_server,&local_444);
      if ((int)sVar3 < 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
                ,0x4b,"%s:%s","recvfrom error:",pcVar5);
        *piVar4 = 0;
        pFVar2 = local_440;
      }
      read_dns_header(&header,buffer);
      if ((header.field_1.flags & 0xf00) != 0x500) {
        uVar7 = uVar7 + 1;
        printf("ERROR %d %s\n",(ulong)uVar7,local_438);
      }
      iVar1 = __isoc99_fscanf(pFVar2,"%s",local_438);
      uVar6 = uVar6 + 1;
    } while (iVar1 == 1);
    if (uVar7 != 0) {
      printf("find %d wrong",(ulong)uVar7);
      goto LAB_001015fa;
    }
  }
  printf(anon_var_dwarf_150);
  system("pause");
  return 0;
}

Assistant:

int main(){
    init();
     FILE *in;
    if( (in = fopen("dnsrelay1.txt","r"))==NULL){//fopen_s和fopen的接口不一样
        log_error_shortcut("file open error:");
        exit(EXIT_FAILURE);
    }
     printf("请确定自己离线中\n");
     #ifdef _WIN64
     Sleep(1000);
     #else
     sleep(1000);
     #endif
    char ip[1024];
    char name[1024];
	char result[10240];
  int error=0;
  int x=0;


    while(fscanf(in, "%s",name)==1){
        printf("%d ===================== %s\n",++x,name);
        struct question dns_question;
        strcpy( dns_question.label,name);
        dns_question.qclass= HTTP_CLASS;
        dns_question.qtype = RRTYPE_A;
        int total_size=write_dns_query(buffer,name,RRTYPE_A);
         if ( (sendto(ss, buffer, total_size, 0, (SA *)&(query_server),sizeof(query_server) )  ) < 0){
            // printf("%d\n",total_size);
          log_error_shortcut("sendto error:");
      }
      int len=sizeof(query_server) ;
      if (( (total_size = recvfrom(ss, buffer, MAX_DNS_SIZE, 0,(SA *)&query_server, &len))<0)){
          log_error_shortcut("recvfrom error:");
      }
      read_dns_header(&header,buffer);
      if(header.rcode!=5){
          printf("ERROR %d %s\n",++error,name);
      }
      
    }
    if(error){
    printf("find %d wrong",error);
    exit(EXIT_FAILURE);}
    else{
      printf("恭喜！\nおめでとうございます\nCongratulations!");
    }
    system("pause");
    return 0;
}